

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O1

void __thiscall LinearExpert::m_step(LinearExpert *this)

{
  Z *this_00;
  XZ *this_01;
  X *pXVar1;
  Z *lhs;
  ZZ *this_02;
  double *pdVar2;
  double **ppdVar3;
  double *pdVar4;
  double dVar5;
  double *pdVar6;
  Scalar SVar7;
  undefined8 *puVar8;
  double *pdVar9;
  Index index;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  ActualDstType actualDst_1;
  Index dstRows_2;
  long lVar13;
  long lVar14;
  Index *pIVar15;
  long lVar16;
  ActualDstType actualDst;
  Index othersize;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Z meanZ;
  X meanX;
  ZZ zz;
  DstEvaluatorType dstEvaluator;
  ThisEvaluator thisEval;
  XZ xz;
  add_assign_op<double,_double> local_129;
  Matrix<double,__1,__1,_0,__1,__1> local_128;
  undefined8 uStack_110;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_108;
  DenseStorage<double,__1,__1,__1,_0> local_f0;
  plainobjectbase_evaluator_data<double,_0> local_d8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::PartialReduxExpr<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::member_sum<double,_double>,_1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  local_d0;
  undefined1 local_b0 [8];
  Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a8;
  plainobjectbase_evaluator_data<double,_0> local_a0;
  scalar_constant_op<double> local_98;
  evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_90;
  plainobjectbase_evaluator_data<double,_0> local_88;
  Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_80;
  XZ *local_78;
  char local_70;
  DenseStorage<double,__1,__1,__1,_0> local_60;
  double local_48;
  undefined8 uStack_40;
  
  uVar10 = (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)this->Sh;
  uStack_110 = 0;
  local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_128,uVar10,1);
  lhs = &this->Sz;
  pdVar9 = (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if (local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows !=
      uVar10) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_128,uVar10,1);
  }
  uVar10 = local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows - (local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows) {
    lVar13 = 0;
    do {
      auVar19._8_4_ =
           (int)local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_cols;
      auVar19._0_8_ =
           local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      auVar19._12_4_ =
           (int)((ulong)local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols >> 0x20);
      auVar19 = divpd(*(undefined1 (*) [16])(pdVar9 + lVar13),auVar19);
      *(undefined1 (*) [16])
       (local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       + lVar13) = auVar19;
      lVar13 = lVar13 + 2;
    } while (lVar13 < (long)uVar10);
  }
  if ((long)uVar10 <
      local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) {
    do {
      local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      [uVar10] = pdVar9[uVar10] /
                 (double)local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols;
      uVar10 = uVar10 + 1;
    } while (local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows != uVar10);
  }
  uVar10 = (this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)this->Sh;
  uStack_110 = 0;
  local_108.m_storage.m_data = (double *)0x0;
  local_108.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_108,uVar10,1);
  pdVar9 = (this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  if (local_108.m_storage.m_rows != uVar10) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_108,uVar10,1);
  }
  pdVar12 = local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data;
  uVar10 = local_108.m_storage.m_rows - (local_108.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_108.m_storage.m_rows) {
    lVar13 = 0;
    do {
      auVar24._8_4_ =
           (int)local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_cols;
      auVar24._0_8_ =
           local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      auVar24._12_4_ =
           (int)((ulong)local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols >> 0x20);
      auVar19 = divpd(*(undefined1 (*) [16])(pdVar9 + lVar13),auVar24);
      *(undefined1 (*) [16])
       (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_108.m_storage.m_data)->
         m_storage).m_data + lVar13) = auVar19;
      lVar13 = lVar13 + 2;
    } while (lVar13 < (long)uVar10);
  }
  if ((long)uVar10 < local_108.m_storage.m_rows) {
    do {
      (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_108.m_storage.m_data)->
        m_storage).m_data)[uVar10] =
           (double *)
           (pdVar9[uVar10] /
           (double)local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols);
      uVar10 = uVar10 + 1;
    } while (local_108.m_storage.m_rows != uVar10);
  }
  dVar5 = this->wNu;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    uStack_110 = 0;
    local_48 = this->Sh + dVar5;
    uStack_40 = 0;
    lVar13 = (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    this_00 = &this->Nu;
    pdVar9 = (this->Nu0).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    pdVar12 = (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
    local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)dVar5;
    if ((this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != lVar13) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar13,1);
    }
    pdVar6 = (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar10 = (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    uVar11 = uVar10 - ((long)uVar10 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar10) {
      auVar21._8_8_ = local_48;
      auVar21._0_8_ = local_48;
      lVar13 = 0;
      do {
        pdVar2 = pdVar9 + lVar13;
        pdVar4 = pdVar12 + lVar13;
        auVar25._0_8_ =
             *pdVar2 * (double)local_128.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_cols + *pdVar4;
        auVar25._8_8_ =
             pdVar2[1] *
             (double)local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols + pdVar4[1];
        auVar19 = divpd(auVar25,auVar21);
        *(undefined1 (*) [16])(pdVar6 + lVar13) = auVar19;
        lVar13 = lVar13 + 2;
      } while (lVar13 < (long)uVar11);
    }
    if ((long)uVar11 < (long)uVar10) {
      do {
        pdVar6[uVar11] =
             (pdVar9[uVar11] *
              (double)local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols + pdVar12[uVar11]) / local_48;
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    this_02 = &this->Sigma;
    pdVar9 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
    lVar13 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
    lVar14 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
    if (((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows != lVar13) ||
       ((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols != lVar14)) {
      if ((lVar14 != 0 && lVar13 != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar14),0) < lVar13))
      goto LAB_00153132;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this_02,lVar14 * lVar13,lVar13,lVar14);
    }
    pdVar12 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
    lVar13 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols *
             (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    uVar10 = lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar13) {
      lVar14 = 0;
      do {
        pdVar6 = pdVar9 + lVar14;
        dVar5 = pdVar6[1];
        pdVar2 = pdVar12 + lVar14;
        *pdVar2 = *pdVar6;
        pdVar2[1] = dVar5;
        lVar14 = lVar14 + 2;
      } while (lVar14 < (long)uVar10);
    }
    if ((long)uVar10 < lVar13) {
      do {
        pdVar12[uVar10] = pdVar9[uVar10];
        uVar10 = uVar10 + 1;
      } while (lVar13 - uVar10 != 0);
    }
    local_90.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)&this->Nu0;
    lVar13 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    lVar14 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols;
    if (lVar13 <= lVar14) {
      lVar14 = lVar13;
    }
    if (0 < lVar14) {
      dVar5 = this->wSigma;
      pdVar9 = (this->mixture->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
               .m_storage.m_data;
      pdVar12 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar16 = 0;
      do {
        *pdVar12 = pdVar9[lVar16] * dVar5 + *pdVar12;
        lVar16 = lVar16 + 1;
        pdVar12 = pdVar12 + lVar13 + 1;
      } while (lVar14 != lVar16);
    }
    local_a8.m_matrix =
         (non_const_type)
         (this->Nu0).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
    ;
    local_98.m_other = this->wNu;
    local_80.m_matrix =
         (non_const_type)
         local_90.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data;
    Eigen::internal::
    outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::internal::generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::DenseShape,Eigen::DenseShape,5>::add>
              (this_02,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_b0,&local_80,(add *)&local_d0,(false_type *)&local_f0);
    local_98.m_other = this->wNu + this->Sh;
    local_a8.m_matrix =
         (non_const_type)
         (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_90.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)this_00;
    local_80.m_matrix = this_00;
    Eigen::internal::
    outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::internal::generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
              (this_02,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_b0,&local_80,(sub *)&local_d0,(false_type *)&local_f0);
    dVar5 = (double)this->d + this->Sh + this->wSigma + 2.0;
    pdVar9 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    lVar13 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols *
             (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    uVar10 = lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar13) {
      auVar22._8_8_ = dVar5;
      auVar22._0_8_ = dVar5;
      lVar14 = 0;
      do {
        auVar19 = divpd(*(undefined1 (*) [16])(pdVar9 + lVar14),auVar22);
        *(undefined1 (*) [16])(pdVar9 + lVar14) = auVar19;
        lVar14 = lVar14 + 2;
      } while (lVar14 < (long)uVar10);
    }
    if ((long)uVar10 < lVar13) {
      do {
        pdVar9[uVar10] = pdVar9[uVar10] / dVar5;
        uVar10 = uVar10 + 1;
      } while (lVar13 - uVar10 != 0);
    }
  }
  else {
    if ((this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows,1);
    }
    pdVar9 = (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar10 = (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    uVar11 = uVar10 - ((long)uVar10 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar10) {
      lVar13 = 0;
      do {
        pdVar6 = pdVar12 + lVar13;
        dVar5 = pdVar6[1];
        pdVar2 = pdVar9 + lVar13;
        *pdVar2 = *pdVar6;
        pdVar2[1] = dVar5;
        lVar13 = lVar13 + 2;
      } while (lVar13 < (long)uVar11);
    }
    if ((long)uVar11 < (long)uVar10) {
      do {
        pdVar9[uVar11] = pdVar12[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    pdVar9 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
    lVar13 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
    lVar14 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
    if (((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows != lVar13) ||
       ((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols != lVar14)) {
      if ((lVar14 != 0 && lVar13 != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar14),0) < lVar13))
      {
LAB_00153132:
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = operator_delete;
        __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&this->Sigma,lVar14 * lVar13,lVar13,lVar14);
    }
    pdVar12 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
    lVar13 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols *
             (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    uVar10 = lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar13) {
      lVar14 = 0;
      do {
        pdVar6 = pdVar9 + lVar14;
        dVar5 = pdVar6[1];
        pdVar2 = pdVar12 + lVar14;
        *pdVar2 = *pdVar6;
        pdVar2[1] = dVar5;
        lVar14 = lVar14 + 2;
      } while (lVar14 < (long)uVar10);
    }
    if ((long)uVar10 < lVar13) {
      do {
        pdVar12[uVar10] = pdVar9[uVar10];
        uVar10 = uVar10 + 1;
      } while (lVar13 - uVar10 != 0);
    }
    lVar13 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    lVar14 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols;
    if (lVar13 <= lVar14) {
      lVar14 = lVar13;
    }
    if (0 < lVar14) {
      dVar5 = this->wSigma;
      pdVar9 = (this->mixture->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
               .m_storage.m_data;
      pdVar12 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar16 = 0;
      do {
        *pdVar12 = pdVar9[lVar16] * dVar5 + *pdVar12;
        lVar16 = lVar16 + 1;
        pdVar12 = pdVar12 + lVar13 + 1;
      } while (lVar14 != lVar16);
    }
    local_b0 = (undefined1  [8])lhs;
    local_a8.m_matrix = &this->Nu;
    Eigen::internal::
    outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::internal::generic_product_impl<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
              (&this->Sigma,lhs,&local_a8,(sub *)&local_d0,(false_type *)&local_f0);
    dVar5 = (double)this->d + this->Sh + this->wSigma + 1.0;
    pdVar9 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    lVar13 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols *
             (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    uVar10 = lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar13) {
      auVar20._8_8_ = dVar5;
      auVar20._0_8_ = dVar5;
      lVar14 = 0;
      do {
        auVar19 = divpd(*(undefined1 (*) [16])(pdVar9 + lVar14),auVar20);
        *(undefined1 (*) [16])(pdVar9 + lVar14) = auVar19;
        lVar14 = lVar14 + 2;
      } while (lVar14 < (long)uVar10);
    }
    if ((long)uVar10 < lVar13) {
      do {
        pdVar9[uVar10] = pdVar9[uVar10] / dVar5;
        uVar10 = uVar10 + 1;
      } while (lVar13 - uVar10 != 0);
    }
  }
  local_b0 = (undefined1  [8])&this->Sigma;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&this->invSigma,(SrcXprType *)local_b0,(assign_op<double,_double> *)&local_d0);
  if ((this->invSigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows == 0) {
    uVar17 = 0;
    uVar18 = 0x3ff00000;
  }
  else {
    Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_b0,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->invSigma);
    if ((long)local_a8.m_matrix <= (long)local_a0.data) {
      local_a0.data = (double *)local_a8.m_matrix;
    }
    if ((Z *)local_a0.data == (Z *)0x0) {
      pdVar9 = (double *)0x3ff0000000000000;
    }
    else {
      pdVar9 = (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_b0)->m_storage)
               .m_data;
      if (1 < (long)local_a0.data) {
        lVar13 = (long)local_a0.data + -0x10 + 0xf;
        pIVar15 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_b0)->
                   m_storage).m_rows + (long)local_a8.m_matrix;
        do {
          pdVar9 = (double *)((double)pdVar9 * (double)*pIVar15);
          pIVar15 = pIVar15 + (long)((long)&((local_a8.m_matrix)->
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            ).m_storage.m_data + 1);
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
    }
    local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)((double)(int)local_70 * (double)pdVar9);
    free(local_88.data);
    free((void *)local_98.m_other);
    free((void *)local_b0);
    uVar17 = (undefined4)
             local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
    uVar18 = (undefined4)
             ((ulong)local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols >> 0x20);
  }
  if ((double)CONCAT44(uVar18,uVar17) < 0.0) {
    dVar5 = sqrt((double)CONCAT44(uVar18,uVar17));
  }
  else {
    dVar5 = SQRT((double)CONCAT44(uVar18,uVar17));
  }
  this->sqrtDetInvSigma = dVar5;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_f0,(DenseStorage<double,__1,__1,__1,_0> *)&this->Szz);
  if (local_f0.m_rows <= local_f0.m_cols) {
    local_f0.m_cols = local_f0.m_rows;
  }
  if (0 < local_f0.m_cols) {
    dVar5 = this->wLambda;
    pdVar9 = local_f0.m_data;
    do {
      *pdVar9 = *pdVar9 + dVar5;
      pdVar9 = pdVar9 + local_f0.m_rows + 1;
      local_f0.m_cols = local_f0.m_cols + -1;
    } while (local_f0.m_cols != 0);
  }
  local_b0 = (undefined1  [8])&local_128;
  local_a8.m_matrix = lhs;
  Eigen::internal::
  outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::internal::generic_product_impl<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_f0,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_b0,&local_a8,(sub *)&local_d0,
             (false_type *)&local_60);
  local_b0 = (undefined1  [8])&local_f0;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&this->varLambda,(SrcXprType *)local_b0,(assign_op<double,_double> *)&local_d0);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_60,(DenseStorage<double,__1,__1,__1,_0> *)&this->Sxz);
  local_b0 = (undefined1  [8])&local_108;
  local_a8.m_matrix = lhs;
  Eigen::internal::
  outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::internal::generic_product_impl<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_60,(Z *)&local_108,&local_a8,
             (sub *)&local_d0,(false_type *)&local_d8);
  this_01 = &this->Lambda;
  lVar13 = (this->varLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols;
  if (((this->Lambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_rows != local_60.m_rows) ||
     ((this->Lambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols != lVar13)) {
    if ((lVar13 != 0 && local_60.m_rows != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar13),0) <
        local_60.m_rows)) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = operator_delete;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)this_01,lVar13 * local_60.m_rows,
               local_60.m_rows,lVar13);
  }
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (this_01,(Matrix<double,__1,__1,_0,__1,__1> *)&local_60,&this->varLambda);
  pdVar9 = local_108.m_storage.m_data;
  pXVar1 = &this->Mu;
  if ((this->Mu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      local_108.m_storage.m_rows) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pXVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               local_108.m_storage.m_rows,1);
  }
  pdVar12 = (this->Mu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar10 = (this->Mu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar11 = uVar10 - ((long)uVar10 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar10) {
    lVar13 = 0;
    do {
      ppdVar3 = &(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pdVar9)->m_storage).
                 m_data + lVar13;
      dVar5 = (double)ppdVar3[1];
      pdVar6 = pdVar12 + lVar13;
      *pdVar6 = (double)*ppdVar3;
      pdVar6[1] = dVar5;
      lVar13 = lVar13 + 2;
    } while (lVar13 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uVar10) {
    do {
      pdVar12[uVar11] =
           (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pdVar9)->
                     m_storage).m_data)[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  local_d0.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
  if ((this->Lambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows == 1) {
    if (local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
        == 0) {
      dVar5 = 0.0;
    }
    else {
      pdVar9 = (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      pdVar12 = (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_data;
      dVar5 = (*pdVar9 -
              *local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data) * *pdVar12;
      if (1 < local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows) {
        uVar10 = 1;
        do {
          pdVar12 = pdVar12 + 1;
          dVar5 = dVar5 + (pdVar9[uVar10] -
                          local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_data[uVar10]) * *pdVar12;
          uVar10 = uVar10 + 1;
        } while (local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows != uVar10);
      }
    }
    pdVar9 = (pXVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    *pdVar9 = dVar5 + *pdVar9;
  }
  else {
    local_a8.m_matrix = (non_const_type)&local_128;
    local_b0 = (undefined1  [8])&this->Nu;
    Eigen::internal::gemv_dense_selector<2,0,true>::
    run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (this_01,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_b0,pXVar1,(Scalar *)&local_d0);
  }
  local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)this->wPsi;
  uStack_110 = 0;
  pdVar9 = (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  lVar13 = (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows;
  if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      lVar13) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar13,1)
    ;
  }
  pdVar12 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar10 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar11 = uVar10 - ((long)uVar10 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar10) {
    lVar13 = 0;
    do {
      pdVar6 = pdVar9 + lVar13;
      dVar5 = pdVar6[1];
      pdVar2 = pdVar12 + lVar13;
      *pdVar2 = *pdVar6 * (double)local_128.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols;
      pdVar2[1] = dVar5 * (double)local_128.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols;
      lVar13 = lVar13 + 2;
    } while (lVar13 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uVar10) {
    do {
      pdVar12[uVar11] =
           pdVar9[uVar11] *
           (double)local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  local_a0.data =
       (this->Sxx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_90.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
       (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
       (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_108.m_storage.m_data;
  local_88.data =
       (this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_d8.data =
       (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_d0.m_dst = (DstEvaluatorType *)&local_d8;
  local_d0.m_functor = &local_129;
  local_d0.m_src = (SrcEvaluatorType *)local_b0;
  local_d0.m_dstExpr = &this->Psi;
  local_80.m_matrix = (non_const_type)&local_60;
  local_78 = this_01;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::PartialReduxExpr<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::member_sum<double,_double>,_1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_3,_0>
  ::run(&local_d0);
  dVar5 = this->wPsi + this->Sh + 2.0;
  pdVar9 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar10 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar11 = uVar10 - ((long)uVar10 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar10) {
    auVar23._8_8_ = dVar5;
    auVar23._0_8_ = dVar5;
    lVar13 = 0;
    do {
      auVar19 = divpd(*(undefined1 (*) [16])(pdVar9 + lVar13),auVar23);
      *(undefined1 (*) [16])(pdVar9 + lVar13) = auVar19;
      lVar13 = lVar13 + 2;
    } while (lVar13 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uVar10) {
    do {
      pdVar9[uVar11] = pdVar9[uVar11] / dVar5;
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  pXVar1 = &this->invPsi;
  pdVar9 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  lVar13 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if ((this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != lVar13) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pXVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar13,1);
  }
  auVar19 = _DAT_0018cd00;
  pdVar12 = (this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar10 = (this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar11 = uVar10 - ((long)uVar10 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar10) {
    lVar13 = 0;
    do {
      auVar24 = divpd(auVar19,*(undefined1 (*) [16])(pdVar9 + lVar13));
      *(undefined1 (*) [16])(pdVar12 + lVar13) = auVar24;
      lVar13 = lVar13 + 2;
    } while (lVar13 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uVar10) {
    do {
      pdVar12[uVar11] = 1.0 / pdVar9[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  if ((this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      == 0) {
    uVar17 = 0;
    uVar18 = 0x3ff00000;
  }
  else {
    local_b0 = (undefined1  [8])
               (pXVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
    SVar7 = Eigen::internal::
            redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
            ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                      ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_b0,
                       (scalar_product_op<double,_double> *)&local_d0,pXVar1);
    uVar17 = SUB84(SVar7,0);
    uVar18 = (undefined4)((ulong)SVar7 >> 0x20);
  }
  if ((double)CONCAT44(uVar18,uVar17) < 0.0) {
    dVar5 = sqrt((double)CONCAT44(uVar18,uVar17));
  }
  else {
    dVar5 = SQRT((double)CONCAT44(uVar18,uVar17));
  }
  this->sqrtDetInvPsi = dVar5;
  this->recompute = true;
  free(local_60.m_data);
  free(local_f0.m_data);
  free(local_108.m_storage.m_data);
  free(local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void LINEAR_EXPERT_base::m_step()
{
    Z meanZ = Sz / Sh;
    X meanX = Sx / Sh;

    if( wNu == 0.0 )
    {
        Nu = meanZ;
        Sigma = Szz;
        Sigma += (wSigma*mixture->getSigma()).asDiagonal();
        Sigma.noalias() -= Sz*Nu.transpose();
        Sigma /= (Sh + wSigma + d + 1.0);
    }
    else
    {
        Nu = (wNu * Nu0 + Sz) / (wNu + Sh);
        Sigma = Szz;
        Sigma += (wSigma*mixture->getSigma()).asDiagonal();
        Sigma.noalias() += (wNu*Nu0)*Nu0.transpose();
        Sigma.noalias() -= ((wNu+Sh)*Nu)*Nu.transpose();
        Sigma /= (Sh + wSigma + d + 2.0);
    }
	invSigma = Sigma.inverse();
    sqrtDetInvSigma = sqrt(invSigma.determinant());

    ZZ zz = Szz;
    zz += (wLambda * Z::Ones(d)).asDiagonal();
    zz.noalias() -= meanZ*Sz.transpose();
    varLambda = zz.inverse();
    XZ xz = Sxz;
    xz.noalias() -= meanX*Sz.transpose();
    Lambda.noalias() = xz * varLambda;
    Mu = meanX;
    Mu.noalias() += Lambda * (Nu - meanZ);

    Psi = wPsi * mixture->getPsi();
    Psi.noalias() += Sxx - meanX.cwiseProduct(Sx) - xz.cwiseProduct(Lambda).rowwise().sum();
    Psi /= (wPsi + Sh + 2.0 );
    invPsi = Psi.cwiseInverse();
    sqrtDetInvPsi = sqrt(invPsi.prod());

    recompute = true;
}